

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::QueryGeometrySeparate::QueryGeometrySeparate
          (QueryGeometrySeparate *this,void **vtt,Context *context,char *test_name,
          char *test_description)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)vtt[2];
  (this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
  _vptr_CaptureGeometryInterleaved = pp_Var1;
  *(void **)((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                    _vptr_CaptureGeometryInterleaved + (long)pp_Var1[-3]) = vtt[3];
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
  _vptr_CaptureGeometryInterleaved = pp_Var1;
  *(void **)((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                    _vptr_CaptureGeometryInterleaved + (long)pp_Var1[-3]) = vtt[4];
  *(void **)((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                    _vptr_CaptureGeometryInterleaved +
            (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                  _vptr_CaptureGeometryInterleaved[-4]) = vtt[5];
  *(undefined8 *)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.field_0x8 =
       0;
  *(undefined4 *)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.field_0x10
       = 0;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
  _vptr_CaptureGeometryInterleaved = pp_Var1;
  *(void **)((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                    _vptr_CaptureGeometryInterleaved + (long)pp_Var1[-3]) = vtt[6];
  *(void **)((long)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                    _vptr_CaptureGeometryInterleaved +
            (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                  _vptr_CaptureGeometryInterleaved[-4]) = vtt[7];
  *(undefined4 *)&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.field_0x14
       = 0;
  *(undefined4 *)
   (&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.field_0xa0 +
   (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
         _vptr_CaptureGeometryInterleaved[-3]) = 3;
  return;
}

Assistant:

gl3cts::TransformFeedback::QueryGeometrySeparate::QueryGeometrySeparate(deqp::Context& context, const char* test_name,
																		const char* test_description)
	: CaptureVertexInterleaved(context, test_name, test_description)
	, CaptureVertexSeparate(context, test_name, test_description)
	, CaptureGeometrySeparate(context, test_name, test_description)
{
	m_query_object		 = 0;
	m_max_vertices_drawn = 3; /* Make buffer smaller up to 3 vertices. */
}